

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O3

void check_initializer(c2m_ctx_t c2m_ctx,decl_t member_decl,type **type_ptr,
                      node_t_conflict initializer,int const_only_p,int top_p)

{
  undefined4 uVar1;
  type_mode tVar2;
  type *left;
  node_t pnVar3;
  size_t mark;
  byte *pbVar4;
  type *ptVar5;
  mir_size_t mVar6;
  anon_union_8_5_3fbb1736_for_u aVar7;
  void *pvVar8;
  bool bVar9;
  undefined1 auVar10 [48];
  MIR_alias_t MVar11;
  type_qual tVar12;
  char cVar13;
  char cVar14;
  undefined2 uVar15;
  type_mode tVar16;
  char cVar17;
  char cVar18;
  undefined2 uVar19;
  uint uVar20;
  int iVar21;
  int iVar22;
  node_t_conflict pnVar23;
  ulong uVar24;
  init_object_t *piVar25;
  ulong uVar26;
  type *ptVar27;
  node_t_conflict pnVar28;
  char *pcVar29;
  expr_conflict *expr;
  size_t sVar30;
  node_code_t nVar31;
  node_t pnVar32;
  VARR_init_object_t *pVVar33;
  arr_type *paVar34;
  mir_llong mVar35;
  bool bVar36;
  pos_t pVar37;
  mir_llong *max_index_00;
  undefined8 uVar38;
  char *detail;
  node_t local_d8;
  mir_llong max_index;
  ulong local_b8;
  ulong local_b0;
  ulong local_a8;
  type **local_a0;
  int addr_p;
  mir_llong offset;
  node_t pnStack_88;
  node_t_conflict pnStack_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  node_t_conflict base;
  node_t_conflict local_48;
  
  left = *type_ptr;
  addr_p = 0;
  local_a0 = type_ptr;
  pnVar23 = get_compound_literal(initializer,&addr_p);
  iVar22 = addr_p;
  if ((addr_p == 0 && pnVar23 != (node_t_conflict)0x0) && (2 < initializer->code - N_STR)) {
    check_assignment_types(c2m_ctx,left,(type *)0x0,(expr_conflict *)initializer->attr,initializer);
    pnVar32 = (pnVar23->u).ops.head;
    initializer = (node_t)0x0;
    if (pnVar32 != (node_t)0x0) {
      initializer = (pnVar32->op_link).next;
    }
  }
  bVar36 = top_p == 0;
  do {
    nVar31 = initializer->code;
    if (nVar31 != N_LIST) {
      if (left->mode == TM_ARR) {
        paVar34 = (left->u).arr_type;
        ptVar27 = paVar34->el_type;
        iVar21 = init_compatible_string_p((node_t_conflict)(ulong)nVar31,ptVar27);
        if (iVar21 != 0) {
          local_d8 = (initializer->u).ops.head;
          pnVar28 = initializer;
          if (2 < nVar31 - N_STR) goto LAB_001836ed;
LAB_001836b6:
          iVar21 = init_compatible_string_p((node_t_conflict)(ulong)nVar31,ptVar27);
          if (iVar21 == 0) {
            if (local_d8 == (node_t)0x0) {
              return;
            }
            if (local_d8->code != N_INIT) {
LAB_0018419b:
              __assert_fail("init->code == N_INIT",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                            ,0x1e29,
                            "void check_initializer(c2m_ctx_t, decl_t, struct type **, node_t, int, int)"
                           );
            }
            goto LAB_00183717;
          }
          pcVar29 = (char *)(pnVar28->u).s.len;
          iVar22 = incomplete_type_p(c2m_ctx,left);
          if (iVar22 != 0) {
            if (pcVar29 < (char *)0x7fffffff) {
              pVar37 = get_node_pos((c2m_ctx_t)c2m_ctx->node_positions,
                                    (node_t_conflict)(ulong)paVar34->size->uid);
              pnVar23 = new_node(c2m_ctx,N_I);
              add_pos(c2m_ctx,pnVar23,pVar37);
              (pnVar23->u).s.s = pcVar29;
              ((left->u).arr_type)->size = pnVar23;
              check(c2m_ctx,((left->u).arr_type)->size,(node_t_conflict)0x0);
              make_type_complete(c2m_ctx,left);
              return;
            }
            __assert_fail("len < MIR_INT_MAX",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                          ,0x1e1c,
                          "void check_initializer(c2m_ctx_t, decl_t, struct type **, node_t, int, int)"
                         );
          }
          if (pcVar29 <= (char *)(*(long *)((long)paVar34->size->attr + 0x30) + 1)) {
            return;
          }
          pVar37 = get_node_pos((c2m_ctx_t)c2m_ctx->node_positions,
                                (node_t_conflict)(ulong)initializer->uid);
          pcVar29 = "string is too long for array initializer";
          goto LAB_00183974;
        }
      }
      expr = (expr_conflict *)initializer->attr;
      if ((((1 < nVar31 - N_STR) &&
           ((undefined1  [64])((undefined1  [64])*expr & (undefined1  [64])0x1) ==
            (undefined1  [64])0x0)) && (const_only_p != 0)) && (nVar31 != N_STR32)) {
        iVar21 = check_const_addr_p(c2m_ctx,initializer,&base,&offset,(int *)&max_index);
        if ((iVar21 != 0) && ((int)max_index == 0)) {
          pbVar4 = (byte *)initializer->attr;
          *pbVar4 = *pbVar4 | 2;
          *(node_t_conflict *)(pbVar4 + 0x10) = base;
          *(ulong *)(pbVar4 + 0x30) = CONCAT44(offset._4_4_,(undefined4)offset);
        }
        expr = (expr_conflict *)initializer->attr;
        if (((undefined1  [64])((undefined1  [64])*expr & (undefined1  [64])0x2) ==
             (undefined1  [64])0x0) && (pnVar23 == (node_t_conflict)0x0 || iVar22 == 0)) {
          pVar37 = get_node_pos((c2m_ctx_t)c2m_ctx->node_positions,
                                (node_t_conflict)(ulong)initializer->uid);
          pcVar29 = 
          "initializer of non-auto or thread local object should be a constant expression or address"
          ;
          goto LAB_00183974;
        }
      }
      check_assignment_types(c2m_ctx,left,(type *)0x0,expr,initializer);
      return;
    }
    local_d8 = (initializer->u).ops.head;
LAB_001836ed:
    if (local_d8 == (node_t)0x0) {
      if (1 < left->mode - TM_ENUM) {
        if (left->mode != TM_BASIC) {
          return;
        }
        if (0xe < (left->u).basic_type - TP_BOOL) {
          return;
        }
      }
      pVar37 = get_node_pos((c2m_ctx_t)c2m_ctx->node_positions,
                            (node_t_conflict)(ulong)initializer->uid);
      pcVar29 = "empty scalar initializer";
      goto LAB_00183974;
    }
    if (local_d8->code != N_INIT) goto LAB_0018419b;
    if (((((local_d8->op_link).next == (node_t)0x0) &&
         (pnVar32 = (local_d8->u).ops.head, pnVar32->code == N_LIST)) &&
        ((pnVar32->u).s.s == (char *)0x0)) &&
       (((pnVar28 = (pnVar32->op_link).next, pnVar28 != (node_t_conflict)0x0 &&
         (nVar31 = pnVar28->code, nVar31 - N_STR < 3)) && (left->mode == TM_ARR)))) {
      paVar34 = (left->u).arr_type;
      ptVar27 = paVar34->el_type;
      goto LAB_001836b6;
    }
LAB_00183717:
    pnVar32 = (local_d8->u).ops.head;
    if (pnVar32->code != N_LIST) {
      __assert_fail("des_list->code == N_LIST",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                    ,0x1e2b,
                    "void check_initializer(c2m_ctx_t, decl_t, struct type **, node_t, int, int)");
    }
    if (left->mode - TM_STRUCT < 3) {
      pVVar33 = c2m_ctx->init_object_path;
      if (pVVar33 == (VARR_init_object_t *)0x0) goto LAB_00184207;
      mark = pVVar33->els_num;
      if (left->mode == TM_ARR) {
        uVar24 = get_arr_type_size(left);
        pVVar33 = c2m_ctx->init_object_path;
        uVar24 = uVar24 >> 0x3f;
        mVar35 = -1;
        sVar30 = pVVar33->els_num;
      }
      else {
        mVar35 = 0;
        uVar24 = 0;
        sVar30 = mark;
      }
      piVar25 = pVVar33->varr;
      if (piVar25 == (init_object_t *)0x0) goto LAB_0018420c;
      uVar26 = sVar30 + 1;
      local_b0 = uVar24;
      if (pVVar33->size < uVar26) {
        sVar30 = (uVar26 >> 1) + uVar26;
        piVar25 = (init_object_t *)realloc(piVar25,sVar30 * 0x18);
        pVVar33->varr = piVar25;
        pVVar33->size = sVar30;
        sVar30 = pVVar33->els_num;
        uVar26 = sVar30 + 1;
      }
      pVVar33->els_num = uVar26;
      piVar25[sVar30].container_type = left;
      piVar25[sVar30].field_designator_p = 0;
      piVar25[sVar30].u.curr_index = mVar35;
      local_b8 = mark + 1;
      max_index = -1;
      goto LAB_00183a1a;
    }
    pnVar3 = (local_d8->op_link).next;
    if (pnVar3 != (node_t)0x0) {
      pVar37 = get_node_pos((c2m_ctx_t)c2m_ctx->node_positions,(node_t_conflict)(ulong)pnVar3->uid);
      pcVar29 = "excess elements in scalar initializer";
      goto LAB_00183974;
    }
    pnVar3 = (pnVar32->u).ops.head;
    if (pnVar3 != (node_t)0x0) {
      pVar37 = get_node_pos((c2m_ctx_t)c2m_ctx->node_positions,(node_t_conflict)(ulong)pnVar3->uid);
      pcVar29 = "designator in scalar initializer";
      goto LAB_00183974;
    }
    initializer = (pnVar32->op_link).next;
    bVar9 = !bVar36;
    bVar36 = true;
  } while (bVar9);
  pVar37 = get_node_pos((c2m_ctx_t)c2m_ctx->node_positions,(node_t_conflict)(ulong)local_d8->uid);
  pcVar29 = "braces around scalar initializer";
LAB_00183974:
  error(c2m_ctx,pcVar29,pVar37.fname,pVar37._8_8_);
  return;
LAB_00183a1a:
  do {
    if (local_d8->code != N_INIT) {
LAB_001841de:
      __assert_fail("init->code == N_INIT",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                    ,0x1e49,
                    "void check_initializer(c2m_ctx_t, decl_t, struct type **, node_t, int, int)");
    }
    pnVar32 = (local_d8->u).ops.head;
    pnVar23 = (pnVar32->op_link).next;
    if (((pnVar23->code == N_LIST) || (pnVar23->code == N_COMPOUND_LITERAL)) &&
       (2 < left->mode - TM_STRUCT)) {
      pVar37 = get_node_pos((c2m_ctx_t)c2m_ctx->node_positions,(node_t_conflict)(ulong)local_d8->uid
                           );
      pcVar29 = "compound literal for scalar initializer";
      if (pnVar23->code == N_LIST) {
        pcVar29 = "braces around scalar initializer";
      }
      error(c2m_ctx,pcVar29,pVar37.fname,pVar37._8_8_);
      break;
    }
    pnVar32 = (pnVar32->u).ops.head;
    if (pnVar32 == (node_t)0x0) {
      pVar37 = get_node_pos((c2m_ctx_t)c2m_ctx->node_positions,(node_t_conflict)(ulong)local_d8->uid
                           );
      iVar22 = update_path_and_do(c2m_ctx,1,check_initializer,mark,pnVar23,const_only_p,&max_index,
                                  pVar37,"array/struct/union");
      if (iVar22 == 0) break;
    }
    else {
      pVVar33 = c2m_ctx->init_object_path;
      if (((pVVar33 == (VARR_init_object_t *)0x0) || (pVVar33->varr == (init_object_t *)0x0)) ||
         (pVVar33->els_num < local_b8)) {
        check_initializer_cold_3();
        goto LAB_001841de;
      }
      bVar36 = false;
      pVVar33->els_num = local_b8;
      ptVar27 = left;
      do {
        pVVar33 = c2m_ctx->init_object_path;
        if (((pVVar33 == (VARR_init_object_t *)0x0) ||
            (piVar25 = pVVar33->varr, piVar25 == (init_object_t *)0x0)) ||
           (sVar30 = pVVar33->els_num, sVar30 == 0)) {
          check_initializer_cold_2();
LAB_0018417c:
          __assert_fail("init_object.container_type->mode == TM_STRUCT || init_object.container_type->mode == TM_UNION"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                        ,0x1e66,
                        "void check_initializer(c2m_ctx_t, decl_t, struct type **, node_t, int, int)"
                       );
        }
        uVar1 = *(undefined4 *)&piVar25[sVar30 - 1].field_0xc;
        if (bVar36) {
          tVar2 = (piVar25[sVar30 - 1].container_type)->mode;
          if (tVar2 - TM_STRUCT < 2) {
            ptVar27 = *(type **)((long)(piVar25[sVar30 - 1].u.curr_member)->attr + 0x40);
          }
          else {
            if (tVar2 != TM_ARR) goto LAB_0018417c;
            ptVar27 = (((piVar25[sVar30 - 1].container_type)->u).ptr_type)->arr_type;
          }
        }
        else {
          pVVar33->els_num = sVar30 - 1;
        }
        if (pnVar32->code == N_FIELD_ID) {
          if ((ptVar27->mode & ~TM_BASIC) != TM_STRUCT) {
            pVar37 = get_node_pos((c2m_ctx_t)c2m_ctx->node_positions,
                                  (node_t_conflict)(ulong)pnVar32->uid);
            pcVar29 = "field name not in struct or union initializer";
            goto LAB_00183c6f;
          }
          pnVar3 = (pnVar32->u).ops.head;
          pnStack_80 = (ptVar27->u).tag_type;
          offset._0_4_ = 0;
          auVar10._4_8_ = pnVar3;
          auVar10._0_4_ = offset._4_4_;
          auVar10._12_8_ = pnStack_80;
          auVar10._20_8_ = uStack_78;
          auVar10._28_8_ = uStack_70;
          auVar10._36_8_ = uStack_68;
          auVar10._44_4_ = 0;
          pnStack_88 = pnVar3;
          iVar22 = HTAB_symbol_t_do(c2m_ctx->symbol_tab,(symbol_t)(auVar10 << 0x20),HTAB_FIND,
                                    (symbol_t *)&base);
          if (iVar22 == 0) {
            pVar37 = get_node_pos((c2m_ctx_t)c2m_ctx->node_positions,
                                  (node_t_conflict)(ulong)pnVar32->uid);
            error(c2m_ctx,0x1bf698,pVar37.fname,pVar37._8_8_,(pnVar3->u).s.s);
          }
          else {
            process_init_field_designator(c2m_ctx,local_48,ptVar27);
            pnVar3 = (pnVar32->op_link).next;
            pVar37 = get_node_pos((c2m_ctx_t)c2m_ctx->node_positions,
                                  (node_t_conflict)(ulong)local_d8->uid);
            detail = "struct/union";
            pcVar29 = pVar37.fname;
            uVar38 = pVar37._8_8_;
            max_index_00 = (mir_llong *)0x0;
LAB_00183bee:
            pVar37.lno = (int)uVar38;
            pVar37.ln_pos = (int)((ulong)uVar38 >> 0x20);
            pVar37.fname = pcVar29;
            iVar22 = update_path_and_do(c2m_ctx,(uint)(pnVar3 == (node_t)0x0),check_initializer,mark
                                        ,pnVar23,const_only_p,max_index_00,pVar37,detail);
            if (iVar22 == 0) break;
          }
        }
        else {
          if (ptVar27->mode == TM_ARR) {
            pbVar4 = (byte *)pnVar32->attr;
            if ((*pbVar4 & 1) == 0) {
              pVar37 = get_node_pos((c2m_ctx_t)c2m_ctx->node_positions,
                                    (node_t_conflict)(ulong)pnVar32->uid);
              pcVar29 = "nonconstant array index in initializer";
            }
            else {
              ptVar5 = *(type **)(pbVar4 + 0x18);
              if ((ptVar5->mode == TM_ENUM) ||
                 ((ptVar5->mode == TM_BASIC && (0xfffffff3 < (ptVar5->u).basic_type - TP_FLOAT)))) {
                iVar22 = incomplete_type_p(c2m_ctx,ptVar27);
                if ((iVar22 == 0) ||
                   ((iVar22 = signed_integer_type_p(ptVar5), iVar22 == 0 ||
                    (-1 < *(long *)(pbVar4 + 0x30))))) {
                  uVar26 = get_arr_type_size(ptVar27);
                  uVar24 = *(ulong *)(pbVar4 + 0x30);
                  if (((long)uVar26 < 0) || (uVar24 < uVar26)) {
                    pVVar33 = c2m_ctx->init_object_path;
                    piVar25 = pVVar33->varr;
                    if (piVar25 != (init_object_t *)0x0) {
                      sVar30 = pVVar33->els_num;
                      uVar26 = sVar30 + 1;
                      if (pVVar33->size < uVar26) {
                        sVar30 = (uVar26 >> 1) + uVar26;
                        local_a8 = uVar24;
                        piVar25 = (init_object_t *)realloc(piVar25,sVar30 * 0x18);
                        pVVar33->varr = piVar25;
                        pVVar33->size = sVar30;
                        sVar30 = pVVar33->els_num;
                        uVar26 = sVar30 + 1;
                        uVar24 = local_a8;
                      }
                      pVVar33->els_num = uVar26;
                      max_index_00 = &max_index;
                      piVar25[sVar30].container_type = ptVar27;
                      piVar25[sVar30].field_designator_p = 0;
                      *(undefined4 *)&piVar25[sVar30].field_0xc = uVar1;
                      piVar25[sVar30].u.curr_member = (node_t_conflict)(uVar24 - 1);
                      pnVar3 = (pnVar32->op_link).next;
                      if (bVar36) {
                        max_index_00 = (mir_llong *)0x0;
                      }
                      pVar37 = get_node_pos((c2m_ctx_t)c2m_ctx->node_positions,
                                            (node_t_conflict)(ulong)local_d8->uid);
                      detail = "array";
                      pcVar29 = pVar37.fname;
                      uVar38 = pVar37._8_8_;
                      goto LAB_00183bee;
                    }
                    check_initializer_cold_1();
                    goto LAB_00184202;
                  }
                  pVar37 = get_node_pos((c2m_ctx_t)c2m_ctx->node_positions,
                                        (node_t_conflict)(ulong)pnVar32->uid);
                  pcVar29 = "array index in initializer exceeds array bounds";
                }
                else {
                  pVar37 = get_node_pos((c2m_ctx_t)c2m_ctx->node_positions,
                                        (node_t_conflict)(ulong)pnVar32->uid);
                  pcVar29 = "negative array index in initializer for array without size";
                }
              }
              else {
                pVar37 = get_node_pos((c2m_ctx_t)c2m_ctx->node_positions,
                                      (node_t_conflict)(ulong)pnVar32->uid);
                pcVar29 = "array index in initializer not of integer type";
              }
            }
          }
          else {
            pVar37 = get_node_pos((c2m_ctx_t)c2m_ctx->node_positions,
                                  (node_t_conflict)(ulong)pnVar32->uid);
            pcVar29 = "array index in initializer for non-array";
          }
LAB_00183c6f:
          error(c2m_ctx,pcVar29,pVar37.fname,pVar37._8_8_);
        }
        pnVar32 = (pnVar32->op_link).next;
        bVar36 = true;
      } while (pnVar32 != (node_t)0x0);
    }
    local_d8 = (local_d8->op_link).next;
  } while (local_d8 != (node_t)0x0);
  ptVar27 = left;
  if (((left->mode == TM_ARR & (byte)local_b0) == 1) && (-1 < max_index)) {
    pnVar23 = (node_t_conflict)reg_malloc(c2m_ctx,0x20);
    ptVar27 = (type *)reg_malloc(c2m_ctx,0x38);
    ptVar5 = left->arr_type;
    MVar11 = left->antialias;
    tVar12 = left->type_qual;
    tVar2 = left->mode;
    cVar13 = left->func_type_before_adjustment_p;
    cVar14 = left->unnamed_anon_struct_union_member_type_p;
    uVar15 = *(undefined2 *)&left->field_0x1e;
    tVar16 = left->mode;
    cVar17 = left->func_type_before_adjustment_p;
    cVar18 = left->unnamed_anon_struct_union_member_type_p;
    uVar19 = *(undefined2 *)&left->field_0x1e;
    iVar22 = left->align;
    uVar1 = *(undefined4 *)&left->field_0x24;
    mVar6 = left->raw_size;
    aVar7 = left->u;
    ptVar27->pos_node = left->pos_node;
    ptVar27->arr_type = ptVar5;
    ptVar27->antialias = MVar11;
    ptVar27->type_qual = tVar12;
    ptVar27->mode = tVar2;
    ptVar27->func_type_before_adjustment_p = cVar13;
    ptVar27->unnamed_anon_struct_union_member_type_p = cVar14;
    *(undefined2 *)&ptVar27->field_0x1e = uVar15;
    ptVar27->mode = tVar16;
    ptVar27->func_type_before_adjustment_p = cVar17;
    ptVar27->unnamed_anon_struct_union_member_type_p = cVar18;
    *(undefined2 *)&ptVar27->field_0x1e = uVar19;
    ptVar27->align = iVar22;
    *(undefined4 *)&ptVar27->field_0x24 = uVar1;
    ptVar27->raw_size = mVar6;
    ptVar27->u = aVar7;
    iVar22 = incomplete_type_p(c2m_ctx,ptVar27);
    if (iVar22 == 0) goto LAB_00184211;
    pnVar28 = (ptVar27->u).tag_type;
    uVar20 = pnVar28->uid;
    pvVar8 = pnVar28->attr;
    pnVar32 = (pnVar28->op_link).prev;
    pnVar3 = (pnVar28->op_link).next;
    pnVar23->code = pnVar28->code;
    pnVar23->uid = uVar20;
    pnVar23->attr = pvVar8;
    (pnVar23->op_link).prev = pnVar32;
    (pnVar23->op_link).next = pnVar3;
    (ptVar27->u).tag_type = pnVar23;
    nVar31 = N_I;
    if (0x7ffffffe < max_index) {
      nVar31 = max_index == 0x7fffffffffffffff | N_L;
    }
    pcVar29 = (char *)(max_index + 1);
    pVar37 = get_node_pos((c2m_ctx_t)c2m_ctx->node_positions,
                          (node_t_conflict)(ulong)((pnVar23->op_link).next)->uid);
    pnVar23 = new_node(c2m_ctx,nVar31);
    add_pos(c2m_ctx,pnVar23,pVar37);
    (pnVar23->u).s.s = pcVar29;
    ((ptVar27->u).arr_type)->size = pnVar23;
    check(c2m_ctx,((ptVar27->u).arr_type)->size,(node_t_conflict)0x0);
    make_type_complete(c2m_ctx,ptVar27);
  }
  pVVar33 = c2m_ctx->init_object_path;
  if (((pVVar33 != (VARR_init_object_t *)0x0) && (pVVar33->varr != (init_object_t *)0x0)) &&
     (mark <= pVVar33->els_num)) {
    pVVar33->els_num = mark;
    *local_a0 = ptVar27;
    return;
  }
LAB_00184202:
  check_initializer_cold_4();
LAB_00184207:
  check_initializer_cold_6();
LAB_0018420c:
  check_initializer_cold_5();
LAB_00184211:
  __assert_fail("incomplete_type_p (c2m_ctx, type)",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                ,0x1e9a,
                "void check_initializer(c2m_ctx_t, decl_t, struct type **, node_t, int, int)");
}

Assistant:

static void check_initializer (c2m_ctx_t c2m_ctx, decl_t member_decl MIR_UNUSED,
                               struct type **type_ptr, node_t initializer, int const_only_p,
                               int top_p) {
  struct type *type = *type_ptr;
  struct expr *cexpr;
  node_t literal, des_list, curr_des, init, str, value, size_node, temp;
  mir_llong max_index;
  mir_llong size_val = 0; /* to remove an uninitialized warning */
  size_t mark, len;
  symbol_t sym;
  init_object_t init_object;
  int addr_p = FALSE; /* to remove an uninitialized warning */

  literal = get_compound_literal (initializer, &addr_p);
  if (literal != NULL && !addr_p && initializer->code != N_STR && initializer->code != N_STR16
      && initializer->code != N_STR32) {
    cexpr = initializer->attr;
    check_assignment_types (c2m_ctx, type, NULL, cexpr, initializer);
    initializer = NL_EL (literal->u.ops, 1);
  }
check_one_value:
  if (initializer->code != N_LIST
      && !(type->mode == TM_ARR
           && init_compatible_string_p (initializer, type->u.arr_type->el_type))) {
    if ((cexpr = initializer->attr)->const_p || initializer->code == N_STR
        || initializer->code == N_STR16 || initializer->code == N_STR32 || !const_only_p) {
      check_assignment_types (c2m_ctx, type, NULL, cexpr, initializer);
    } else {
      setup_const_addr_p (c2m_ctx, initializer);
      if ((cexpr = initializer->attr)->const_addr_p || (literal != NULL && addr_p))
        check_assignment_types (c2m_ctx, type, NULL, cexpr, initializer);
      else
        error (c2m_ctx, POS (initializer),
               "initializer of non-auto or thread local object"
               " should be a constant expression or address");
    }
    return;
  }
  init = NL_HEAD (initializer->u.ops);
  if (((str = initializer)->code == N_STR || str->code == N_STR16
       || str->code == N_STR32 /* string or string in parentheses */
       || (init != NULL && init->code == N_INIT && NL_EL (initializer->u.ops, 1) == NULL
           && (des_list = NL_HEAD (init->u.ops))->code == N_LIST
           && NL_HEAD (des_list->u.ops) == NULL && NL_EL (init->u.ops, 1) != NULL
           && ((str = NL_EL (init->u.ops, 1))->code == N_STR || str->code == N_STR16
               || str->code == N_STR32)))
      && type->mode == TM_ARR && init_compatible_string_p (str, type->u.arr_type->el_type)) {
    len = str->u.s.len;
    if (incomplete_type_p (c2m_ctx, type)) {
      assert (len < MIR_INT_MAX);
      type->u.arr_type->size = new_i_node (c2m_ctx, (long) len, POS (type->u.arr_type->size));
      check (c2m_ctx, type->u.arr_type->size, NULL);
      make_type_complete (c2m_ctx, type);
    } else if (len > (size_t) ((struct expr *) type->u.arr_type->size->attr)->c.i_val + 1) {
      error (c2m_ctx, POS (initializer), "string is too long for array initializer");
    }
    return;
  }
  if (init == NULL) {
    if (scalar_type_p (type)) error (c2m_ctx, POS (initializer), "empty scalar initializer");
    return;
  }
  assert (init->code == N_INIT);
  des_list = NL_HEAD (init->u.ops);
  assert (des_list->code == N_LIST);
  if (type->mode != TM_ARR && type->mode != TM_STRUCT && type->mode != TM_UNION) {
    if ((temp = NL_NEXT (init)) != NULL) {
      error (c2m_ctx, POS (temp), "excess elements in scalar initializer");
      return;
    }
    if ((temp = NL_HEAD (des_list->u.ops)) != NULL) {
      error (c2m_ctx, POS (temp), "designator in scalar initializer");
      return;
    }
    initializer = NL_NEXT (des_list);
    if (!top_p) {
      error (c2m_ctx, POS (init), "braces around scalar initializer");
      return;
    }
    top_p = FALSE;
    goto check_one_value;
  }
  mark = VARR_LENGTH (init_object_t, init_object_path);
  init_object.container_type = type;
  init_object.field_designator_p = FALSE;
  if (type->mode == TM_ARR) {
    size_val = get_arr_type_size (type);
    init_object.u.curr_index = -1;
  } else {
    init_object.u.curr_member = NULL;
  }
  VARR_PUSH (init_object_t, init_object_path, init_object);
  max_index = -1;
  for (; init != NULL; init = NL_NEXT (init)) {
    assert (init->code == N_INIT);
    des_list = NL_HEAD (init->u.ops);
    value = NL_NEXT (des_list);
    if ((value->code == N_LIST || value->code == N_COMPOUND_LITERAL) && type->mode != TM_ARR
        && type->mode != TM_STRUCT && type->mode != TM_UNION) {
      error (c2m_ctx, POS (init),
             value->code == N_LIST ? "braces around scalar initializer"
                                   : "compound literal for scalar initializer");
      break;
    }
    if ((curr_des = NL_HEAD (des_list->u.ops)) == NULL) {
      if (!update_path_and_do (c2m_ctx, TRUE, check_initializer, mark, value, const_only_p,
                               &max_index, POS (init), "array/struct/union"))
        break;
    } else {
      struct type *curr_type = type;
      mir_llong arr_size_val MIR_UNUSED;
      int first_p = TRUE;

      VARR_TRUNC (init_object_t, init_object_path, mark + 1);
      for (; curr_des != NULL; curr_des = NL_NEXT (curr_des), first_p = FALSE) {
        init_object = VARR_LAST (init_object_t, init_object_path);
        if (first_p) {
          VARR_POP (init_object_t, init_object_path);
        } else {
          if (init_object.container_type->mode == TM_ARR) {
            curr_type = init_object.container_type->u.arr_type->el_type;
          } else {
            assert (init_object.container_type->mode == TM_STRUCT
                    || init_object.container_type->mode == TM_UNION);
            decl_t el_decl = init_object.u.curr_member->attr;
            curr_type = el_decl->decl_spec.type;
          }
        }
        if (curr_des->code == N_FIELD_ID) {
          node_t id = NL_HEAD (curr_des->u.ops);

          if (curr_type->mode != TM_STRUCT && curr_type->mode != TM_UNION) {
            error (c2m_ctx, POS (curr_des), "field name not in struct or union initializer");
          } else if (!symbol_find (c2m_ctx, S_REGULAR, id, curr_type->u.tag_type, &sym)) {
            error (c2m_ctx, POS (curr_des), "unknown field %s in initializer", id->u.s.s);
          } else {
            process_init_field_designator (c2m_ctx, sym.def_node, curr_type);
            if (!update_path_and_do (c2m_ctx, NL_NEXT (curr_des) == NULL, check_initializer, mark,
                                     value, const_only_p, NULL, POS (init), "struct/union"))
              break;
          }
        } else if (curr_type->mode != TM_ARR) {
          error (c2m_ctx, POS (curr_des), "array index in initializer for non-array");
        } else if (!(cexpr = curr_des->attr)->const_p) {
          error (c2m_ctx, POS (curr_des), "nonconstant array index in initializer");
        } else if (!integer_type_p (cexpr->type)) {
          error (c2m_ctx, POS (curr_des), "array index in initializer not of integer type");
        } else if (incomplete_type_p (c2m_ctx, curr_type) && signed_integer_type_p (cexpr->type)
                   && cexpr->c.i_val < 0) {
          error (c2m_ctx, POS (curr_des),
                 "negative array index in initializer for array without size");
        } else if ((arr_size_val = get_arr_type_size (curr_type)) >= 0
                   && (mir_ullong) arr_size_val <= cexpr->c.u_val) {
          error (c2m_ctx, POS (curr_des), "array index in initializer exceeds array bounds");
        } else {
          init_object.u.curr_index = cexpr->c.i_val - 1; /* previous el */
          init_object.field_designator_p = FALSE;
          init_object.container_type = curr_type;
          VARR_PUSH (init_object_t, init_object_path, init_object);
          if (!update_path_and_do (c2m_ctx, NL_NEXT (curr_des) == NULL, check_initializer, mark,
                                   value, const_only_p, first_p ? &max_index : NULL, POS (init),
                                   "array"))
            break;
        }
      }
    }
  }
  if (type->mode == TM_ARR && size_val < 0 && max_index >= 0) {
    /* Array w/o size: define it.  Copy the type as the incomplete
       type can be shared by declarations with different length
       initializers.  We need only one level of copying as sub-array
       can not have incomplete type with an initializer. */
    struct arr_type *arr_type = reg_malloc (c2m_ctx, sizeof (struct arr_type));

    type = create_type (c2m_ctx, type);
    assert (incomplete_type_p (c2m_ctx, type));
    *arr_type = *type->u.arr_type;
    type->u.arr_type = arr_type;
    size_node = type->u.arr_type->size;
    type->u.arr_type->size
      = (max_index < MIR_INT_MAX    ? new_i_node (c2m_ctx, (long) max_index + 1, POS (size_node))
         : max_index < MIR_LONG_MAX ? new_l_node (c2m_ctx, (long) max_index + 1, POS (size_node))
                                    : new_ll_node (c2m_ctx, max_index + 1, POS (size_node)));
    check (c2m_ctx, type->u.arr_type->size, NULL);
    make_type_complete (c2m_ctx, type);
  }
  VARR_TRUNC (init_object_t, init_object_path, mark);
  *type_ptr = type;
  return;
}